

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_public.c
# Opt level: O1

void nhr_request_add_header_field(nhr_request request,char *name,char *value)

{
  int iVar1;
  size_t len;
  size_t len_00;
  _nhr_map_node *p_Var2;
  char *pcVar3;
  
  if (request != (nhr_request)0x0) {
    if (name == (char *)0x0) {
      len = 0;
    }
    else {
      len = strlen(name);
    }
    if (value == (char *)0x0) {
      len_00 = 0;
    }
    else {
      len_00 = strlen(value);
    }
    if (len_00 != 0 && len != 0) {
      if (request->http_headers == (_nhr_map_node *)0x0) {
        p_Var2 = nhr_map_create();
        request->http_headers = p_Var2;
      }
      p_Var2 = nhr_map_append(request->http_headers);
      pcVar3 = nhr_string_copy_len(name,len);
      p_Var2->key = pcVar3;
      pcVar3 = nhr_string_copy_len(value,len_00);
      (p_Var2->value).string = pcVar3;
      p_Var2->value_size = len_00;
      p_Var2->value_type = '\x02';
      iVar1 = strcmp(value,"gzip");
      if (iVar1 == 0) {
        request->is_gziped = '\x01';
      }
      iVar1 = strcmp(value,"deflate");
      if (iVar1 == 0) {
        request->is_deflated = '\x01';
      }
    }
  }
  return;
}

Assistant:

void nhr_request_add_header_field(nhr_request request, const char * name, const char * value) {
	size_t name_len = 0, value_len = 0;
	_nhr_map_node * last = NULL;
	if (!request) {
		return;
	}

	name_len = name ? strlen(name) : 0;
	value_len = value ? strlen(value) : 0;
	if (name_len == 0 || value_len == 0) {
		return;
	}
	if (!request->http_headers) {
		request->http_headers = nhr_map_create();
	}
	
	last = nhr_map_append(request->http_headers);
	last->key = nhr_string_copy_len(name, name_len);
	last->value.string = nhr_string_copy_len(value, value_len);
    last->value_size = value_len;
	last->value_type = NHR_MAP_VALUE_STRING;
#if defined(NHR_GZIP)
	if (strcmp(value, k_nhr_gzip) == 0) {
		request->is_gziped = nhr_true;
	}
	if (strcmp(value, k_nhr_deflate) == 0) {
		request->is_deflated = nhr_true;
	}
#endif
}